

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

int isBinary(char p)

{
  int local_c;
  char p_local;
  
  switch(p) {
  case '*':
  case '+':
  case ',':
  case '-':
  case '/':
  case '<':
  case '=':
  case '>':
  case '@':
  case '~':
    local_c = 1;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int isBinary(char p)
{
    switch (p) {
    case '+':
    case '*':
    case '-':
    case '/':
    case '<':
    case '=':
    case '>':
    case '@':
    case '~':
    case ',':
        return 1;
    }
    return 0;
}